

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

int pybind11_getbuffer(PyObject *obj,Py_buffer *view,int flags)

{
  bool bVar1;
  PyObject **ppPVar2;
  undefined8 *puVar3;
  reference plVar4;
  char *pcVar5;
  reference pvVar6;
  long s;
  iterator __end2_1;
  iterator __begin2_1;
  vector<long,_std::allocator<long>_> *__range2_1;
  buffer_info *info;
  handle type;
  sequence_fast_readonly local_68;
  tuple_iterator __end2;
  sequence_fast_readonly local_50;
  tuple_iterator __begin2;
  tuple local_40;
  pybind11 *local_38;
  tuple *__range2;
  type_info *tinfo;
  Py_buffer *pPStack_20;
  int flags_local;
  Py_buffer *view_local;
  PyObject *obj_local;
  
  __range2 = (tuple *)0x0;
  tinfo._4_4_ = flags;
  pPStack_20 = view;
  view_local = (Py_buffer *)obj;
  pybind11::handle::handle((handle *)&__begin2,obj->ob_type->tp_mro);
  pybind11::reinterpret_borrow<pybind11::tuple>
            ((pybind11 *)&local_40,(handle)__begin2.super_sequence_fast_readonly.ptr);
  local_38 = (pybind11 *)&local_40;
  local_50.ptr = (PyObject **)pybind11::tuple::begin(&local_40);
  local_68.ptr = (PyObject **)pybind11::tuple::end((tuple *)local_38);
  while (bVar1 = pybind11::detail::operator!=((It *)&local_50,(It *)&local_68), bVar1) {
    info = (buffer_info *)
           pybind11::detail::
           generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>::operator*
                     ((generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>
                       *)&local_50);
    ppPVar2 = pybind11::handle::ptr((handle *)&info);
    __range2 = (tuple *)pybind11::detail::get_type_info((PyTypeObject *)*ppPVar2);
    if (((type_info *)__range2 != (type_info *)0x0) &&
       (((type_info *)__range2)->get_buffer != (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0))
    break;
    pybind11::detail::generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>
    ::operator++((generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly> *)
                 &local_50);
  }
  type.m_ptr._4_4_ = 2;
  pybind11::tuple::~tuple(&local_40);
  if ((pPStack_20 == (Py_buffer *)0x0) ||
     (((view_local == (Py_buffer *)0x0 || (__range2 == (tuple *)0x0)) ||
      (__range2[0xe].super_object.super_handle.m_ptr == (PyObject *)0x0)))) {
    if (pPStack_20 != (Py_buffer *)0x0) {
      pPStack_20->obj = (PyObject *)0x0;
    }
    PyErr_SetString(_PyExc_BufferError,"pybind11_getbuffer(): Internal error");
    obj_local._4_4_ = -1;
  }
  else {
    memset(pPStack_20,0,0x50);
    puVar3 = (undefined8 *)
             (*(code *)__range2[0xe].super_object.super_handle.m_ptr)
                       (view_local,__range2[0xf].super_object.super_handle.m_ptr);
    pPStack_20->obj = (PyObject *)view_local;
    pPStack_20->ndim = 1;
    pPStack_20->internal = puVar3;
    pPStack_20->buf = (void *)*puVar3;
    pPStack_20->itemsize = puVar3[1];
    pPStack_20->len = pPStack_20->itemsize;
    __end2_1 = std::vector<long,_std::allocator<long>_>::begin
                         ((vector<long,_std::allocator<long>_> *)(puVar3 + 8));
    s = (long)std::vector<long,_std::allocator<long>_>::end
                        ((vector<long,_std::allocator<long>_> *)(puVar3 + 8));
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)&s), bVar1) {
      plVar4 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator*(&__end2_1);
      pPStack_20->len = *plVar4 * pPStack_20->len;
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                (&__end2_1);
    }
    if ((tinfo._4_4_ & 4) == 4) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      pPStack_20->format = pcVar5;
    }
    if ((tinfo._4_4_ & 0x18) == 0x18) {
      pPStack_20->ndim = (int)puVar3[7];
      pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)(puVar3 + 0xb),0);
      pPStack_20->strides = pvVar6;
      pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)(puVar3 + 8),0);
      pPStack_20->shape = pvVar6;
    }
    _Py_INCREF(pPStack_20->obj);
    obj_local._4_4_ = 0;
  }
  return obj_local._4_4_;
}

Assistant:

inline int pybind11_getbuffer(PyObject *obj, Py_buffer *view, int flags) {
    // Look for a `get_buffer` implementation in this type's info or any bases (following MRO).
    type_info *tinfo = nullptr;
    for (auto type : reinterpret_borrow<tuple>(Py_TYPE(obj)->tp_mro)) {
        tinfo = get_type_info((PyTypeObject *) type.ptr());
        if (tinfo && tinfo->get_buffer)
            break;
    }
    if (view == nullptr || obj == nullptr || !tinfo || !tinfo->get_buffer) {
        if (view)
            view->obj = nullptr;
        PyErr_SetString(PyExc_BufferError, "pybind11_getbuffer(): Internal error");
        return -1;
    }
    std::memset(view, 0, sizeof(Py_buffer));
    buffer_info *info = tinfo->get_buffer(obj, tinfo->get_buffer_data);
    view->obj = obj;
    view->ndim = 1;
    view->internal = info;
    view->buf = info->ptr;
    view->itemsize = info->itemsize;
    view->len = view->itemsize;
    for (auto s : info->shape)
        view->len *= s;
    if ((flags & PyBUF_FORMAT) == PyBUF_FORMAT)
        view->format = const_cast<char *>(info->format.c_str());
    if ((flags & PyBUF_STRIDES) == PyBUF_STRIDES) {
        view->ndim = (int) info->ndim;
        view->strides = &info->strides[0];
        view->shape = &info->shape[0];
    }
    Py_INCREF(view->obj);
    return 0;
}